

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BranchLayerParams::MergeFrom(BranchLayerParams *this,BranchLayerParams *from)

{
  void *pvVar1;
  LogMessage *other;
  NeuralNetwork *pNVar2;
  NeuralNetwork *pNVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x55dd);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pNVar3 = from->ifbranch_;
  if (pNVar3 != (NeuralNetwork *)0x0 &&
      from != (BranchLayerParams *)&_BranchLayerParams_default_instance_) {
    pNVar2 = this->ifbranch_;
    if (pNVar2 == (NeuralNetwork *)0x0) {
      pNVar2 = (NeuralNetwork *)operator_new(0x58);
      NeuralNetwork::NeuralNetwork(pNVar2);
      this->ifbranch_ = pNVar2;
      pNVar3 = from->ifbranch_;
    }
    if (pNVar3 == (NeuralNetwork *)0x0) {
      pNVar3 = (NeuralNetwork *)&_NeuralNetwork_default_instance_;
    }
    NeuralNetwork::MergeFrom(pNVar2,pNVar3);
  }
  pNVar3 = from->elsebranch_;
  if (pNVar3 != (NeuralNetwork *)0x0 &&
      from != (BranchLayerParams *)&_BranchLayerParams_default_instance_) {
    pNVar2 = this->elsebranch_;
    if (pNVar2 == (NeuralNetwork *)0x0) {
      pNVar2 = (NeuralNetwork *)operator_new(0x58);
      NeuralNetwork::NeuralNetwork(pNVar2);
      this->elsebranch_ = pNVar2;
      pNVar3 = from->elsebranch_;
    }
    if (pNVar3 == (NeuralNetwork *)0x0) {
      pNVar3 = (NeuralNetwork *)&_NeuralNetwork_default_instance_;
    }
    NeuralNetwork::MergeFrom(pNVar2,pNVar3);
  }
  return;
}

Assistant:

void BranchLayerParams::MergeFrom(const BranchLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BranchLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_ifbranch()) {
    mutable_ifbranch()->::CoreML::Specification::NeuralNetwork::MergeFrom(from.ifbranch());
  }
  if (from.has_elsebranch()) {
    mutable_elsebranch()->::CoreML::Specification::NeuralNetwork::MergeFrom(from.elsebranch());
  }
}